

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathLocalNameFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlElementType xVar1;
  xmlXPathObjectPtr *ppxVar2;
  xmlNodeSetPtr pxVar3;
  xmlNodePtr pxVar4;
  xmlXPathObjectPtr pxVar5;
  xmlXPathObjectPtr value;
  uint uVar6;
  int iVar7;
  _xmlNode *val;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs != 1) {
    if (nargs != 0) {
      iVar7 = 0xc;
      goto LAB_001becd8;
    }
    pxVar5 = xmlXPathCacheNewNodeSet(ctxt,ctxt->context->node);
    xmlXPathValuePush(ctxt,pxVar5);
  }
  iVar7 = ctxt->valueNr;
  if ((long)iVar7 < 1) {
    iVar7 = 0x17;
LAB_001becd8:
    xmlXPathErr(ctxt,iVar7);
    return;
  }
  if ((ctxt->value == (xmlXPathObjectPtr)0x0) ||
     ((ctxt->value->type | XPATH_USERS) != XPATH_XSLT_TREE)) {
    iVar7 = 0xb;
    goto LAB_001becd8;
  }
  uVar6 = iVar7 - 1;
  ctxt->valueNr = uVar6;
  ppxVar2 = ctxt->valueTab;
  if (iVar7 == 1) {
    pxVar5 = (xmlXPathObjectPtr)0x0;
  }
  else {
    pxVar5 = ppxVar2[(long)iVar7 + -2];
  }
  ctxt->value = pxVar5;
  pxVar5 = ppxVar2[uVar6];
  ppxVar2[uVar6] = (xmlXPathObjectPtr)0x0;
  pxVar3 = pxVar5->nodesetval;
  if ((pxVar3 != (xmlNodeSetPtr)0x0) && (pxVar3->nodeNr != 0)) {
    pxVar4 = *pxVar3->nodeTab;
    xVar1 = pxVar4->type;
    if (1 < xVar1 - XML_ELEMENT_NODE) {
      if (xVar1 == XML_NAMESPACE_DECL) {
        val = pxVar4->children;
        goto LAB_001bed35;
      }
      if (xVar1 != XML_PI_NODE) goto LAB_001bed2e;
    }
    val = (_xmlNode *)pxVar4->name;
    if (*(xmlChar *)&val->_private != ' ') goto LAB_001bed35;
  }
LAB_001bed2e:
  val = (_xmlNode *)0x1de21b;
LAB_001bed35:
  value = xmlXPathCacheNewString(ctxt,(xmlChar *)val);
  xmlXPathValuePush(ctxt,value);
  xmlXPathReleaseObject(ctxt->context,pxVar5);
  return;
}

Assistant:

void
xmlXPathLocalNameFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr cur;

    if (ctxt == NULL) return;

    if (nargs == 0) {
	xmlXPathValuePush(ctxt, xmlXPathCacheNewNodeSet(ctxt, ctxt->context->node));
	nargs = 1;
    }

    CHECK_ARITY(1);
    if ((ctxt->value == NULL) ||
	((ctxt->value->type != XPATH_NODESET) &&
	 (ctxt->value->type != XPATH_XSLT_TREE)))
	XP_ERROR(XPATH_INVALID_TYPE);
    cur = xmlXPathValuePop(ctxt);

    if ((cur->nodesetval == NULL) || (cur->nodesetval->nodeNr == 0)) {
	xmlXPathValuePush(ctxt, xmlXPathCacheNewCString(ctxt, ""));
    } else {
	int i = 0; /* Should be first in document order !!!!! */
	switch (cur->nodesetval->nodeTab[i]->type) {
	case XML_ELEMENT_NODE:
	case XML_ATTRIBUTE_NODE:
	case XML_PI_NODE:
	    if (cur->nodesetval->nodeTab[i]->name[0] == ' ')
		xmlXPathValuePush(ctxt, xmlXPathCacheNewCString(ctxt, ""));
	    else
		xmlXPathValuePush(ctxt, xmlXPathCacheNewString(ctxt,
			cur->nodesetval->nodeTab[i]->name));
	    break;
	case XML_NAMESPACE_DECL:
	    xmlXPathValuePush(ctxt, xmlXPathCacheNewString(ctxt,
			((xmlNsPtr)cur->nodesetval->nodeTab[i])->prefix));
	    break;
	default:
	    xmlXPathValuePush(ctxt, xmlXPathCacheNewCString(ctxt, ""));
	}
    }
    xmlXPathReleaseObject(ctxt->context, cur);
}